

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O0

void m256v_add_inplace(m256v *A,m256v *B_inout)

{
  m256v *in_RSI;
  undefined8 in_RDI;
  int r;
  m256v *unaff_retaddr;
  int rt;
  
  for (rt = 0; rt < in_RSI->n_row; rt = rt + 1) {
    m256v_multadd_row(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(uint8_t)((ulong)in_RDI >> 0x18),
                      in_RSI,rt);
  }
  return;
}

Assistant:

void MV_GEN_N(_add_inplace)(const MV_GEN_TYPE* A, MV_GEN_TYPE* B_inout)
{
	assert(A->n_row == B_inout->n_row);
	assert(A->n_col == B_inout->n_col);

	for (int r = 0; r < B_inout->n_row; ++r) {
		MV_GEN_N(_multadd_row)(A, r, 1, B_inout, r);
	}
}